

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  int rc;
  Pager *pPager_local;
  
  iVar1 = pagerLockDb(pPager,4);
  if (iVar1 != 0) {
    pagerUnlockDb(pPager,1);
  }
  return iVar1;
}

Assistant:

static int pagerExclusiveLock(Pager *pPager){
  int rc;                         /* Return code */

  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );
  rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
  if( rc!=SQLITE_OK ){
    /* If the attempt to grab the exclusive lock failed, release the 
    ** pending lock that may have been obtained instead.  */
    pagerUnlockDb(pPager, SHARED_LOCK);
  }

  return rc;
}